

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr local_30;
  xmlXPathObjectPtr res;
  xmlXPathParserContextPtr ctxt;
  xmlXPathContextPtr ctx_local;
  xmlChar *str_local;
  
  if (ctx == (xmlXPathContextPtr)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    xmlInitParser();
    xmlResetError(&ctx->lastError);
    ctxt_00 = xmlXPathNewParserContext(str,ctx);
    if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
      str_local = (xmlChar *)0x0;
    }
    else {
      xmlXPathEvalExpr(ctxt_00);
      if (ctxt_00->error == 0) {
        if (ctxt_00->valueNr == 1) {
          local_30 = xmlXPathValuePop(ctxt_00);
        }
        else {
          xmlXPathErr(ctxt_00,0x17);
          local_30 = (xmlXPathObjectPtr)0x0;
        }
      }
      else {
        local_30 = (xmlXPathObjectPtr)0x0;
      }
      xmlXPathFreeParserContext(ctxt_00);
      str_local = (xmlChar *)local_30;
    }
  }
  return (xmlXPathObjectPtr)str_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res;

    if (ctx == NULL)
        return(NULL);

    xmlInitParser();

    xmlResetError(&ctx->lastError);

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
        return NULL;
    xmlXPathEvalExpr(ctxt);

    if (ctxt->error != XPATH_EXPRESSION_OK) {
	res = NULL;
    } else if (ctxt->valueNr != 1) {
        xmlXPathErr(ctxt, XPATH_STACK_ERROR);
	res = NULL;
    } else {
	res = xmlXPathValuePop(ctxt);
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}